

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O0

adios2_engine * adios2_get_engine(adios2_io *io,char *name)

{
  adios2_engine *paVar1;
  adios2_io *in_RSI;
  string *in_RDI;
  adios2_engine *engine;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  string *hint;
  
  hint = (string *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"for adios2_io, in call to adios2_open",&local_39);
  adios2::helper::CheckForNullptr<adios2_io>(in_RSI,hint);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,(char *)in_RSI,&local_71);
  paVar1 = (adios2_engine *)adios2::core::IO::GetEngine(in_RDI);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  return paVar1;
}

Assistant:

adios2_engine *adios2_get_engine(adios2_io *io, const char *name)
{
    adios2_engine *engine = nullptr;
    try
    {
        adios2::helper::CheckForNullptr(io, "for adios2_io, in call to adios2_open");
        engine = reinterpret_cast<adios2_engine *>(
            &reinterpret_cast<adios2::core::IO *>(io)->GetEngine(name));
    }
    catch (...)
    {
        adios2::helper::ExceptionToError("adios2_open");
    }
    return engine;
}